

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubsetTests.cpp
# Opt level: O0

void __thiscall
IsIterableNotContainingSubsetTests::IsIterableNotContainingSubsetTests
          (IsIterableNotContainingSubsetTests *this)

{
  IsIterableNotContainingSubsetTests *this_local;
  
  ut11::TestFixture::TestFixture(&this->super_TestFixture);
  (this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract =
       (_func_int **)&PTR__IsIterableNotContainingSubsetTests_006166c8;
  return;
}

Assistant:

virtual void Run()
	{
		Then("a vector containing the passed int is not true", []() {
			AssertThat(ut11::Is::Iterable::Not::Containing::Subset(std::vector<int>({4,2}))(std::vector<int>({1,2,3,4,5})), ut11::Is::Not::True);
		});

		Then("a vector containing an equivalent set of the passed set is not true", []() {
			AssertThat(ut11::Is::Iterable::Not::Containing::Subset(std::vector<int>({1,2,3,4,5}))(std::vector<int>({1,2,3,4,5})), ut11::Is::Not::True);
		});

		Then("a vector not containing the passed int is not false", []() {
			AssertThat(ut11::Is::Iterable::Not::Containing::Subset(std::vector<int>({4,8}))(std::vector<int>({1,2,3,4,5})), ut11::Is::Not::False);
		});

		Then("a vector containing a subset of the passed set is not false", []() {
			AssertThat(ut11::Is::Iterable::Not::Containing::Subset(std::vector<int>({1,2,3,4,5,6}))(std::vector<int>({1,2,3,4,5})), ut11::Is::Not::False);
		});

		Then("Is::Iterable::Containing::Subset() is an operand", []() {
			AssertThat(ut11::detail::IsOperand< decltype(ut11::Is::Iterable::Not::Containing::Subset(5)) >::value, ut11::Is::True);
		});

		Then("Is::Iterable::Containing::Subset() has an error message", []() {
			AssertThat(ut11::Is::Iterable::Not::Containing::Subset(5).GetErrorMessage(std::vector<int>()), ut11::Is::Not::EqualTo(""));
		});
	}